

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O2

void __thiscall booster::locale::calendar::calendar(calendar *this,string *zone)

{
  calendar_facet *pcVar1;
  abstract_calendar *paVar2;
  locale local_20;
  
  std::locale::locale(&this->locale_);
  std::__cxx11::string::string((string *)&this->tz_,(string *)zone);
  std::locale::locale(&local_20);
  pcVar1 = std::use_facet<booster::locale::calendar_facet>(&local_20);
  paVar2 = (abstract_calendar *)(**(code **)(*(long *)pcVar1 + 0x10))(pcVar1);
  (this->impl_).ptr_ = paVar2;
  std::locale::~locale(&local_20);
  paVar2 = (this->impl_).ptr_;
  (*paVar2->_vptr_abstract_calendar[10])(paVar2,&this->tz_);
  return;
}

Assistant:

calendar::calendar(std::string const &zone) :
    tz_(zone),
    impl_(std::use_facet<calendar_facet>(std::locale()).create_calendar())
{
    impl_->set_timezone(tz_);
}